

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

void __thiscall
capnp::SchemaLoader::Validator::validate(Validator *this,Reader *structNode,uint64_t scopeId)

{
  void *pvVar1;
  bool bVar2;
  Validator *pVVar3;
  StructDataBitCount SVar4;
  uint uVar5;
  size_t count;
  bool *__s;
  ulong uVar6;
  int iVar7;
  ushort uVar8;
  ulong uVar9;
  uint uVar10;
  uint64_t id;
  uint index;
  uint uVar11;
  ArrayPtr<unsigned_short> AVar12;
  StringPtr name;
  bool fieldIsPointer;
  Validator *local_270;
  uint dataSizeInBits;
  ulong local_260;
  uint fieldBits;
  uint pointerCount;
  Reader *local_250;
  ulong local_248;
  bool *local_240;
  ListElementCount local_234;
  uint64_t local_230;
  Array<bool> sawDiscriminantValue_heap;
  Array<bool> sawCodeOrder_heap;
  Fault f_3;
  uint local_1a8;
  anon_class_8_1_a7e8901a _kjContextFunc338;
  IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
  local_198;
  Reader field;
  Fault f;
  Reader fields;
  Reader local_d8;
  Fault f_7;
  bool sawDiscriminantValue_stack [32];
  bool sawCodeOrder_stack [32];
  
  uVar5 = (structNode->_reader).dataSize;
  if (uVar5 < 0x80) {
    dataSizeInBits = 0;
    pointerCount = 0;
  }
  else {
    dataSizeInBits = (uint)*(ushort *)((long)(structNode->_reader).data + 0xe) << 6;
    pointerCount = 0;
    if (0xcf < uVar5) {
      pointerCount = (uint)*(ushort *)((long)(structNode->_reader).data + 0x18);
    }
  }
  local_270 = this;
  capnp::schema::Node::Struct::Reader::getFields(&fields,structNode);
  uVar9 = (ulong)fields.reader.elementCount;
  if (uVar9 < 0x21) {
    sawCodeOrder_heap.ptr = (bool *)0x0;
    sawCodeOrder_heap.size_ = 0;
    sawCodeOrder_heap.disposer = (ArrayDisposer *)0x0;
    local_240 = sawCodeOrder_stack;
  }
  else {
    local_240 = kj::_::HeapArrayDisposer::allocate<bool>(uVar9);
    sawCodeOrder_heap.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    sawCodeOrder_heap.ptr = local_240;
    sawCodeOrder_heap.size_ = uVar9;
  }
  memset(local_240,0,uVar9);
  if ((structNode->_reader).dataSize < 0x100) {
    count = 0;
LAB_00171df4:
    sawDiscriminantValue_heap.ptr = (bool *)0x0;
    sawDiscriminantValue_heap.size_ = 0;
    sawDiscriminantValue_heap.disposer = (ArrayDisposer *)0x0;
    __s = sawDiscriminantValue_stack;
  }
  else {
    count = (size_t)*(ushort *)((long)(structNode->_reader).data + 0x1e);
    if (count < 0x21) goto LAB_00171df4;
    __s = kj::_::HeapArrayDisposer::allocate<bool>(count);
    sawDiscriminantValue_heap.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    sawDiscriminantValue_heap.ptr = __s;
    sawDiscriminantValue_heap.size_ = count;
  }
  memset(__s,0,count);
  pVVar3 = local_270;
  uVar5 = (structNode->_reader).dataSize;
  if (0xff < uVar5) {
    pvVar1 = (structNode->_reader).data;
    uVar8 = *(ushort *)((long)pvVar1 + 0x1e);
    if (uVar8 != 0) {
      if (uVar8 == 1) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37]>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x143,FAILED,"structNode.getDiscriminantCount() != 1",
                   "\"union must have at least two members\"",
                   (char (*) [37])"union must have at least two members");
        local_270->isValid = false;
        kj::_::Debug::Fault::~Fault(&f);
        goto LAB_00172423;
      }
      if (fields.reader.elementCount < uVar8) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[54]>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x145,FAILED,"structNode.getDiscriminantCount() <= fields.size()",
                   "\"struct can\'t have more union fields than total fields\"",
                   (char (*) [54])"struct can\'t have more union fields than total fields");
        local_270->isValid = false;
        kj::_::Debug::Fault::~Fault(&f);
        goto LAB_00172423;
      }
      if (uVar5 < 0x120) {
        uVar5 = 0x10;
      }
      else {
        uVar5 = *(int *)((long)pvVar1 + 0x20) * 0x10 + 0x10;
      }
      if (dataSizeInBits < uVar5) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[36]>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x148,FAILED,"(structNode.getDiscriminantOffset() + 1) * 16 <= dataSizeInBits",
                   "\"union discriminant is out-of-bounds\"",
                   (char (*) [36])"union discriminant is out-of-bounds");
        local_270->isValid = false;
        kj::_::Debug::Fault::~Fault(&f);
        goto LAB_00172423;
      }
    }
  }
  local_230 = scopeId;
  AVar12 = kj::Arena::allocateArray<unsigned_short>
                     (&local_270->loader->arena,(ulong)fields.reader.elementCount);
  pVVar3->membersByDiscriminant = AVar12;
  uVar5 = 0;
  if (0xff < (structNode->_reader).dataSize) {
    uVar5 = (uint)*(ushort *)((long)(structNode->_reader).data + 0x1e);
  }
  local_234 = fields.reader.elementCount;
  uVar11 = 0;
  index = 0;
  local_248 = 0;
  local_260 = uVar9;
  local_250 = structNode;
  local_198.container = &fields;
  for (local_198.index = 0; local_198.index != local_234; local_198.index = local_198.index + 1) {
    _::
    IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
    ::operator*(&field,&local_198);
    _kjContextFunc338.field = &field;
    kj::_::Debug::
    ContextImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++:338:7)>
    ::ContextImpl((ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_schema_loader_c__:338:7)>
                   *)&f,&_kjContextFunc338);
    name.content = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName(&field);
    validateMemberName(local_270,name,index);
    SVar4 = field._reader.dataSize;
    pvVar1 = field._reader.data;
    if (field._reader.dataSize < 0x10) {
      if (((uint)uVar9 == 0) || (*local_240 != false)) goto LAB_00172258;
      uVar6 = 0;
LAB_00171fbe:
      local_240[uVar6] = true;
      uVar10 = uVar11;
      if (field._reader.dataSize < 0x60) {
        if (0x1f < field._reader.dataSize) goto LAB_00172012;
LAB_00172059:
        if (fields.reader.elementCount < uVar5) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39]>
                    (&f_3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                     ,0x16a,FAILED,"nonDiscriminantPos <= fields.size()",
                     "\"discriminantCount did not match fields\"",
                     (char (*) [39])"discriminantCount did not match fields");
          uVar9 = local_260;
          local_270->isValid = false;
          kj::_::Debug::Fault::~Fault(&f_3);
        }
        else {
          uVar10 = uVar5;
          uVar5 = uVar5 + 1;
LAB_00172072:
          (local_270->membersByDiscriminant).ptr[uVar10] = (unsigned_short)index;
          uVar9 = local_260;
          if (0x4f < field._reader.dataSize) {
            if (*(short *)((long)field._reader.data + 8) == 1) {
              if (field._reader.dataSize < 0xc0) {
                id = 0;
              }
              else {
                id = *(uint64_t *)((long)field._reader.data + 0x10);
              }
              validateTypeId(local_270,id,STRUCT);
            }
            else if (*(short *)((long)field._reader.data + 8) == 0) goto LAB_001720a4;
LAB_00172227:
            index = index + 1;
            bVar2 = true;
            goto LAB_0017222d;
          }
LAB_001720a4:
          f_3.exception = (Exception *)field._reader.segment;
          fieldBits = 0;
          fieldIsPointer = false;
          capnp::schema::Field::Slot::Reader::getType((Reader *)&f_7,(Reader *)&f_3);
          capnp::schema::Field::Slot::Reader::getDefaultValue(&local_d8,(Reader *)&f_3);
          validate(local_270,(Reader *)&f_7,&local_d8,&fieldBits,&fieldIsPointer);
          iVar7 = 1;
          if (0x3f < SVar4) {
            iVar7 = *(int *)((long)pvVar1 + 4) + 1;
          }
          if (iVar7 * fieldBits <= dataSizeInBits) {
            iVar7 = 1;
            if (0x3f < SVar4) {
              iVar7 = *(int *)((long)pvVar1 + 4) + 1;
            }
            if ((uint)fieldIsPointer * iVar7 <= pointerCount) goto LAB_00172227;
          }
          local_d8._reader.segment._0_4_ = 0;
          if (0x3f < SVar4) {
            local_d8._reader.segment._0_4_ = *(undefined4 *)((long)pvVar1 + 4);
          }
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,char_const(&)[27],unsigned_int,unsigned_int&,unsigned_int&>
                    (&f_7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                     ,0x178,FAILED,
                     "fieldBits * (slot.getOffset() + 1) <= dataSizeInBits && fieldIsPointer * (slot.getOffset() + 1) <= pointerCount"
                     ,
                     "\"field offset out-of-bounds\", slot.getOffset(), dataSizeInBits, pointerCount"
                     ,(char (*) [27])"field offset out-of-bounds",(uint *)&local_d8,&dataSizeInBits,
                     &pointerCount);
          local_270->isValid = false;
          kj::_::Debug::Fault::~Fault(&f_7);
        }
        goto LAB_00172345;
      }
      if (*(short *)((long)field._reader.data + 10) != 1) {
LAB_00172012:
        uVar11 = uVar10;
        if (*(ushort *)((long)field._reader.data + 2) == 0) goto LAB_00172059;
        uVar8 = ~*(ushort *)((long)field._reader.data + 2);
        local_1a8 = (uint)count;
        if ((local_1a8 <= uVar8) || (__s[uVar8] == true)) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
                    (&f_3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                     ,0x164,FAILED,
                     "field.getDiscriminantValue() < sawDiscriminantValue.size() && !sawDiscriminantValue[field.getDiscriminantValue()]"
                     ,"\"invalid discriminantValue\"",(char (*) [26])"invalid discriminantValue");
          local_270->isValid = false;
          kj::_::Debug::Fault::~Fault(&f_3);
          goto LAB_00172398;
        }
        __s[uVar8] = true;
        uVar10 = (uint)local_248;
        local_248 = (ulong)(uVar10 + 1);
        goto LAB_00172072;
      }
      if (field._reader.dataSize < 0x70) {
        uVar10 = 1;
        if (uVar11 == 0) goto LAB_00172012;
      }
      else if (uVar11 <= *(ushort *)((long)field._reader.data + 0xc)) {
        uVar10 = *(ushort *)((long)field._reader.data + 0xc) + 1;
        goto LAB_00172012;
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[35]>
                (&f_3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x15d,FAILED,"ordinal.getExplicit() >= nextOrdinal",
                 "\"fields were not ordered by ordinal\"",
                 (char (*) [35])"fields were not ordered by ordinal");
      local_270->isValid = false;
      kj::_::Debug::Fault::~Fault(&f_3);
LAB_00172398:
      bVar2 = false;
      uVar9 = local_260;
    }
    else {
      uVar6 = (ulong)*field._reader.data;
      if (((uint)*field._reader.data < (uint)uVar9) && (local_240[uVar6] == false))
      goto LAB_00171fbe;
LAB_00172258:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[18]>
                (&f_3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x157,FAILED,
                 "field.getCodeOrder() < sawCodeOrder.size() && !sawCodeOrder[field.getCodeOrder()]"
                 ,"\"invalid codeOrder\"",(char (*) [18])"invalid codeOrder");
      local_270->isValid = false;
      kj::_::Debug::Fault::~Fault(&f_3);
LAB_00172345:
      bVar2 = false;
    }
LAB_0017222d:
    kj::_::Debug::Context::~Context((Context *)&f);
    if (!bVar2) goto LAB_00172423;
  }
  uVar11 = (local_250->_reader).dataSize;
  uVar10 = 0;
  if (0xff < uVar11) {
    uVar10 = (uint)*(ushort *)((long)(local_250->_reader).data + 0x1e);
  }
  if ((uint)local_248 != uVar10) {
    kj::_::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x187,FAILED,"discriminantPos == structNode.getDiscriminantCount()","");
    kj::_::Debug::Fault::fatal(&f);
  }
  if (uVar5 != fields.reader.elementCount) {
    kj::_::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x188,FAILED,"nonDiscriminantPos == fields.size()","");
    kj::_::Debug::Fault::fatal(&f);
  }
  if ((0xe0 < uVar11) &&
     (pvVar1 = (local_250->_reader).data, (*(byte *)((long)pvVar1 + 0x1c) & 1) != 0)) {
    if (local_230 == 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[27]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x18b,FAILED,"scopeId != 0","\"group node missing scopeId\"",
                 (char (*) [27])"group node missing scopeId");
      local_270->isValid = false;
      kj::_::Debug::Fault::~Fault(&f);
    }
    else {
      Impl::requireStructSize
                (local_270->loader,local_230,(uint)*(ushort *)((long)pvVar1 + 0xe),
                 (uint)*(ushort *)((long)pvVar1 + 0x18));
      validateTypeId(local_270,local_230,STRUCT);
    }
  }
LAB_00172423:
  kj::Array<bool>::~Array(&sawDiscriminantValue_heap);
  kj::Array<bool>::~Array(&sawCodeOrder_heap);
  return;
}

Assistant:

void validate(const schema::Node::Struct::Reader& structNode, uint64_t scopeId) {
    uint dataSizeInBits = structNode.getDataWordCount() * 64;
    uint pointerCount = structNode.getPointerCount();

    auto fields = structNode.getFields();

    KJ_STACK_ARRAY(bool, sawCodeOrder, fields.size(), 32, 256);
    memset(sawCodeOrder.begin(), 0, sawCodeOrder.size() * sizeof(sawCodeOrder[0]));

    KJ_STACK_ARRAY(bool, sawDiscriminantValue, structNode.getDiscriminantCount(), 32, 256);
    memset(sawDiscriminantValue.begin(), 0,
           sawDiscriminantValue.size() * sizeof(sawDiscriminantValue[0]));

    if (structNode.getDiscriminantCount() > 0) {
      VALIDATE_SCHEMA(structNode.getDiscriminantCount() != 1,
                      "union must have at least two members");
      VALIDATE_SCHEMA(structNode.getDiscriminantCount() <= fields.size(),
                      "struct can't have more union fields than total fields");

      VALIDATE_SCHEMA((structNode.getDiscriminantOffset() + 1) * 16 <= dataSizeInBits,
                      "union discriminant is out-of-bounds");
    }